

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O3

shared_ptr<rcg::Device> __thiscall
rcg::Interface::getDevice(Interface *this,char *devid,uint64_t timeout)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  enable_shared_from_this<rcg::Interface> *peVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  int iVar5;
  string *psVar6;
  size_t sVar7;
  Device *pDVar8;
  uint64_t in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  shared_ptr<rcg::Device> sVar12;
  shared_ptr<rcg::Device> p;
  vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_> list;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  element_type *local_a0;
  string local_98;
  __weak_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2> *local_70;
  string local_68;
  vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_> local_48;
  
  getDevices(&local_48,(Interface *)devid,in_RCX);
  (this->super_enable_shared_from_this<rcg::Interface>)._M_weak_this.
  super___weak_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<rcg::Interface>)._M_weak_this.
  super___weak_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_a0 = (element_type *)this;
  if (local_48.
      super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_48.
      super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    peVar2 = &this->super_enable_shared_from_this<rcg::Interface>;
    lVar9 = 8;
    uVar10 = 0;
    local_70 = (__weak_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2> *)devid;
    do {
      pDVar8 = *(Device **)
                ((long)local_48.
                       super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar9 + -8);
      local_a8._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
            ((long)&((local_48.
                      super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + lVar9);
      if (local_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_a8._M_pi)->_M_use_count = (local_a8._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_a8._M_pi)->_M_use_count = (local_a8._M_pi)->_M_use_count + 1;
        }
      }
      if (pDVar8 != (Device *)0x0) {
        psVar6 = Device::getID_abi_cxx11_(pDVar8);
        iVar5 = std::__cxx11::string::compare((char *)psVar6);
        if (iVar5 != 0) {
          Device::getDisplayName_abi_cxx11_(&local_98,pDVar8);
          iVar5 = std::__cxx11::string::compare((char *)&local_98);
          if (iVar5 == 0) {
            bVar11 = true;
          }
          else {
            Device::getSerialNumber_abi_cxx11_(&local_68,pDVar8);
            iVar5 = std::__cxx11::string::compare((char *)&local_68);
            bVar11 = iVar5 == 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p);
          }
          this = (Interface *)local_a0;
          if (!bVar11) goto LAB_0010d3b4;
        }
        if ((((element_type *)this)->super_enable_shared_from_this<rcg::Device>)._M_weak_this.
            super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
        {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "There is more than one device with ID, serial number or user defined name: ",
                     0x4b);
          if (timeout == 0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12e5c0);
          }
          else {
            sVar7 = strlen((char *)timeout);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,(char *)timeout,sVar7);
          }
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x40);
          std::ostream::put(-0x40);
          std::ostream::flush();
          p_Var1 = (((element_type *)this)->super_enable_shared_from_this<rcg::Device>)._M_weak_this
                   .super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          (((element_type *)this)->super_enable_shared_from_this<rcg::Device>)._M_weak_this.
          super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
          (((element_type *)this)->super_enable_shared_from_this<rcg::Device>)._M_weak_this.
          super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
          }
          if (local_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8._M_pi);
          }
          break;
        }
        (((element_type *)this)->super_enable_shared_from_this<rcg::Device>)._M_weak_this.
        super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pDVar8;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &(peVar2->_M_weak_this).
                    super___weak_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   &local_a8);
      }
LAB_0010d3b4:
      if (local_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8._M_pi);
      }
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0x10;
    } while (uVar10 < (ulong)((long)local_48.
                                    super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_48.
                                    super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4));
    devid = (char *)local_70;
    if ((((element_type *)this)->super_enable_shared_from_this<rcg::Device>)._M_weak_this.
        super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
    goto LAB_0010d569;
  }
  if (((__weak_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2> *)((long)devid + 0x80))->_M_ptr !=
      (element_type *)0x0) {
    iVar5 = (*(code *)((__weak_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2> *)
                      ((long)devid + 0x20))->_M_ptr[1].gentl.
                      super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)
                      (((__weak_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2> *)
                       ((long)devid + 0x80))->_M_ptr,timeout,2);
    if (1 < iVar5 + 0x3edU) {
      if (iVar5 != 0) goto LAB_0010d569;
      (*((__shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2> *)
        &((__weak_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2> *)((long)devid + 0x20))->_M_ptr)->
        _M_ptr->DevClose)((DEV_HANDLE)0x0);
    }
    pDVar8 = (Device *)operator_new(0x130);
    std::__shared_ptr<rcg::Interface,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<rcg::Interface,void>
              ((__shared_ptr<rcg::Interface,(__gnu_cxx::_Lock_policy)2> *)&local_68,
               (__weak_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2> *)devid);
    Device::Device(pDVar8,(shared_ptr<rcg::Interface> *)&local_68,
                   (shared_ptr<const_rcg::GenTLWrapper> *)((long)devid + 0x20),(char *)timeout);
    std::__shared_ptr<rcg::Device,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<rcg::Device,void>
              ((__shared_ptr<rcg::Device,(__gnu_cxx::_Lock_policy)2> *)&local_98,pDVar8);
    sVar4 = local_98._M_string_length;
    _Var3._M_p = local_98._M_dataplus._M_p;
    local_98._M_dataplus._M_p = (pointer)0x0;
    local_98._M_string_length = 0;
    p_Var1 = (((element_type *)this)->super_enable_shared_from_this<rcg::Device>)._M_weak_this.
             super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (((element_type *)this)->super_enable_shared_from_this<rcg::Device>)._M_weak_this.
    super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)_Var3._M_p;
    (((element_type *)this)->super_enable_shared_from_this<rcg::Device>)._M_weak_this.
    super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar4;
    if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1),
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length !=
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length);
    }
  }
LAB_0010d569:
  std::vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>::~vector
            (&local_48);
  sVar12.super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar12.super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<rcg::Device>)sVar12.super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<Device> Interface::getDevice(const char *devid, uint64_t timeout)
{
  // get list of all devices

  std::vector<std::shared_ptr<Device> > list=getDevices(timeout);

  // find requested device by ID or user defined name

  std::shared_ptr<Device> ret;

  for (size_t i=0; i<list.size(); i++)
  {
    std::shared_ptr<Device> p=list[i];

    if (p && (p->getID() == devid || p->getDisplayName() == devid ||
              p->getSerialNumber() == devid))
    {
      if (ret)
      {
        std::cerr << "There is more than one device with ID, serial number or user defined name: "
                  << devid << std::endl;
        ret=0;
        break;
      }

      ret=p;
    }
  }

  if (!ret && ifh != 0)
  {
    // try to open the device in a last attempt to check if the producer is
    // able to find it

    GenTL::DEV_HANDLE dev=0;

    GenTL::GC_ERROR err=gentl->IFOpenDevice(ifh, devid, GenTL::DEVICE_ACCESS_READONLY, &dev);

    if (err == GenTL::GC_ERR_SUCCESS)
    {
      gentl->DevClose(dev);
    }

    if (err == GenTL::GC_ERR_SUCCESS || err == GenTL::GC_ERR_RESOURCE_IN_USE ||
        err == GenTL::GC_ERR_ACCESS_DENIED)
    {
      ret=std::shared_ptr<Device>(new Device(shared_from_this(), gentl, devid));
    }
  }

  return ret;
}